

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

void __thiscall ddd::DaTrie<false,_false,_false>::pop_block_(DaTrie<false,_false,_false> *this)

{
  pointer *ppBVar1;
  pointer *ppBVar2;
  
  pop_block_(this,(int)((ulong)((long)(this->blocks_).
                                      super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->blocks_).
                                     super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>.
                                     _M_impl.super__Vector_impl_data._M_start) >> 2) - 1,
             &this->blocks_);
  ppBVar1 = &(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppBVar1 = *ppBVar1 + -0x100;
  ppBVar2 = &(this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppBVar2 = *ppBVar2 + -1;
  this->bc_emps_ = this->bc_emps_ - 0x100;
  return;
}

Assistant:

void pop_block_() {
    assert(!bc_.empty());

    auto block_pos = num_blocks() - 1;
    pop_block_(block_pos, blocks_);

    for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
      bc_.pop_back();
    }
    if (WithNLM) {
      for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
        node_links_.pop_back();
      }
    }

    blocks_.pop_back();
    bc_emps_ -= BLOCK_SIZE;
  }